

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Reader::readArray(Reader *this,Token *tokenStart)

{
  bool bVar1;
  Value *pVVar2;
  Value *this_00;
  long in_RSI;
  Reader *in_RDI;
  Reader *in_stack_00000048;
  bool badTokenType;
  Token token;
  bool ok;
  Value *value;
  int index;
  Token endArray;
  undefined4 in_stack_ffffffffffffff08;
  TokenType in_stack_ffffffffffffff0c;
  Value *in_stack_ffffffffffffff10;
  Token *token_00;
  undefined4 in_stack_ffffffffffffff18;
  undefined2 in_stack_ffffffffffffff1c;
  undefined1 in_stack_ffffffffffffff1e;
  undefined1 in_stack_ffffffffffffff1f;
  undefined1 uVar3;
  Reader *in_stack_ffffffffffffff30;
  string local_c8 [8];
  Value *in_stack_ffffffffffffff40;
  int local_a0;
  bool local_81;
  bool local_1;
  
  Value::Value((Value *)in_RDI,
               CONCAT13(in_stack_ffffffffffffff1f,
                        CONCAT12(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff1c)));
  pVVar2 = currentValue((Reader *)0x122610);
  Value::operator=(in_stack_ffffffffffffff10,
                   (Value *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  Value::~Value(in_stack_ffffffffffffff40);
  this_00 = currentValue((Reader *)0x122642);
  Value::setOffsetStart(this_00,*(long *)(in_RSI + 8) - (long)in_RDI->begin_);
  skipSpaces(in_RDI);
  if (*in_RDI->current_ == ']') {
    readToken(in_RDI,(Token *)CONCAT17(in_stack_ffffffffffffff1f,
                                       CONCAT16(in_stack_ffffffffffffff1e,
                                                CONCAT24(in_stack_ffffffffffffff1c,
                                                         in_stack_ffffffffffffff18))));
    local_1 = true;
  }
  else {
    while( true ) {
      currentValue((Reader *)0x1226dd);
      Value::operator[]((Value *)in_stack_ffffffffffffff30,(int)((ulong)pVVar2 >> 0x20));
      std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::push
                ((stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_> *
                 )in_stack_ffffffffffffff10,
                 (value_type *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      bVar1 = readValue(in_stack_00000048);
      std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::pop
                ((stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_> *
                 )0x122736);
      if (!bVar1) break;
      local_81 = readToken(in_RDI,(Token *)CONCAT17(in_stack_ffffffffffffff1f,
                                                    CONCAT16(in_stack_ffffffffffffff1e,
                                                             CONCAT24(in_stack_ffffffffffffff1c,
                                                                      in_stack_ffffffffffffff18))));
      while( true ) {
        uVar3 = false;
        if (local_a0 == 0xc) {
          uVar3 = local_81;
        }
        if ((bool)uVar3 == false) break;
        local_81 = readToken(in_RDI,(Token *)CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffff1e,
                                                                     CONCAT24(
                                                  in_stack_ffffffffffffff1c,
                                                  in_stack_ffffffffffffff18))));
      }
      in_stack_ffffffffffffff1e = local_a0 != 10 && local_a0 != 4;
      if ((local_81 == false) || (local_a0 != 10 && local_a0 != 4)) {
        token_00 = (Token *)&stack0xffffffffffffff37;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_c8,"Missing \',\' or \']\' in array declaration",(allocator *)token_00);
        bVar1 = addErrorAndRecover(in_RDI,(string *)
                                          CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffff1e,
                                                                  CONCAT24(in_stack_ffffffffffffff1c
                                                                           ,
                                                  in_stack_ffffffffffffff18))),token_00,
                                   in_stack_ffffffffffffff0c);
        std::__cxx11::string::~string(local_c8);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff37);
        return bVar1;
      }
      if (local_a0 == 4) {
        return true;
      }
      in_stack_ffffffffffffff1f = 0;
    }
    local_1 = recoverFromError(in_stack_ffffffffffffff30,(TokenType)((ulong)pVVar2 >> 0x20));
  }
  return local_1;
}

Assistant:

bool Reader::readArray(Token& tokenStart) {
  currentValue() = Value(arrayValue);
  currentValue().setOffsetStart(tokenStart.start_ - begin_);
  skipSpaces();
  if (*current_ == ']') // empty array
  {
    Token endArray;
    readToken(endArray);
    return true;
  }
  int index = 0;
  for (;;) {
    Value& value = currentValue()[index++];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenArrayEnd);

    Token token;
    // Accept Comment after last item in the array.
    ok = readToken(token);
    while (token.type_ == tokenComment && ok) {
      ok = readToken(token);
    }
    bool badTokenType =
        (token.type_ != tokenArraySeparator && token.type_ != tokenArrayEnd);
    if (!ok || badTokenType) {
      return addErrorAndRecover(
          "Missing ',' or ']' in array declaration", token, tokenArrayEnd);
    }
    if (token.type_ == tokenArrayEnd)
      break;
  }
  return true;
}